

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

ImPlotLimits * ImPlot::GetPlotSelection(ImPlotLimits *__return_storage_ptr__,ImPlotYAxis y_axis)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImPlotPlot *pIVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ImPlotPoint IVar10;
  ImVec2 local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  if (3 < y_axis + 1U) {
    __assert_fail("(y_axis >= -1 && y_axis < 3) && \"y_axis needs to between -1 and IMPLOT_Y_AXES\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xaa8,"ImPlotLimits ImPlot::GetPlotSelection(ImPlotYAxis)");
  }
  pIVar3 = GImPlot->CurrentPlot;
  if (pIVar3 != (ImPlotPlot *)0x0) {
    if (y_axis < 0) {
      y_axis = pIVar3->CurrentYAxis;
    }
    dVar6 = 0.0;
    dVar7 = 0.0;
    uVar4 = 0;
    uVar5 = 0;
    dVar8 = 0.0;
    if (pIVar3->Selected == true) {
      UpdateTransformCache();
      IVar1 = (pIVar3->SelectRect).Min;
      IVar2 = (pIVar3->PlotRect).Min;
      uVar4 = 0;
      uVar5 = 0;
      local_50.y = IVar2.y + IVar1.y;
      local_50.x = IVar2.x + IVar1.x;
      IVar10 = PixelsToPlot(&local_50,y_axis);
      local_48._8_4_ = extraout_XMM0_Dc;
      local_48._0_8_ = IVar10.x;
      local_48._12_4_ = extraout_XMM0_Dd;
      local_38._8_4_ = uVar4;
      local_38._0_8_ = IVar10.y;
      local_38._12_4_ = uVar5;
      IVar1 = (pIVar3->SelectRect).Max;
      IVar2 = (pIVar3->PlotRect).Min;
      local_50.y = IVar2.y + IVar1.y;
      local_50.x = IVar2.x + IVar1.x;
      IVar10 = PixelsToPlot(&local_50,y_axis);
      dVar7 = IVar10.x;
      dVar6 = (double)local_48._0_8_;
      if (dVar7 <= (double)local_48._0_8_) {
        dVar6 = dVar7;
      }
      dVar7 = (double)(~-(ulong)(dVar7 <= (double)local_48._0_8_) & (ulong)dVar7 |
                      local_48._0_8_ & -(ulong)(dVar7 <= (double)local_48._0_8_));
      dVar9 = local_38._0_8_;
      dVar8 = IVar10.y;
      uVar4 = local_38._0_4_;
      uVar5 = local_38._4_4_;
      if (dVar8 <= dVar9) {
        uVar4 = IVar10.y._0_4_;
        uVar5 = IVar10.y._4_4_;
      }
      dVar8 = (double)(~-(ulong)(dVar8 <= dVar9) & (ulong)dVar8 |
                      (ulong)dVar9 & -(ulong)(dVar8 <= dVar9));
    }
    (__return_storage_ptr__->X).Min = dVar6;
    (__return_storage_ptr__->X).Max = dVar7;
    (__return_storage_ptr__->Y).Min = (double)CONCAT44(uVar5,uVar4);
    (__return_storage_ptr__->Y).Max = dVar8;
    return __return_storage_ptr__;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"GetPlotSelection() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xaa9,"ImPlotLimits ImPlot::GetPlotSelection(ImPlotYAxis)");
}

Assistant:

ImPlotLimits GetPlotSelection(ImPlotYAxis y_axis) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(y_axis >= -1 && y_axis < IMPLOT_Y_AXES, "y_axis needs to between -1 and IMPLOT_Y_AXES");
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "GetPlotSelection() needs to be called between BeginPlot() and EndPlot()!");
    ImPlotPlot& plot = *gp.CurrentPlot;
    y_axis = y_axis >= 0 ? y_axis : gp.CurrentPlot->CurrentYAxis;
    if (!plot.Selected)
        return ImPlotLimits(0,0,0,0);
    UpdateTransformCache();
    ImPlotPoint p1 = PixelsToPlot(plot.SelectRect.Min + plot.PlotRect.Min, y_axis);
    ImPlotPoint p2 = PixelsToPlot(plot.SelectRect.Max + plot.PlotRect.Min, y_axis);
    ImPlotLimits result;
    result.X.Min = ImMin(p1.x, p2.x);
    result.X.Max = ImMax(p1.x, p2.x);
    result.Y.Min = ImMin(p1.y, p2.y);
    result.Y.Max = ImMax(p1.y, p2.y);
    return result;
}